

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O2

void loader_unload_children(loader_impl impl)

{
  loader_manager_impl manager_impl;
  uint64_t uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  loader_impl impl_00;
  long lVar5;
  loader_initialization_order order;
  loader_impl local_38;
  
  local_38 = impl;
  manager_impl = (loader_manager_impl)plugin_manager_impl(&loader_manager);
  uVar1 = thread_id_get_current();
  lVar2 = vector_size(manager_impl->initialization_order);
  uVar3 = vector_create(8);
  for (lVar5 = 0; lVar2 != lVar5; lVar5 = lVar5 + 1) {
    order = (loader_initialization_order)vector_at(manager_impl->initialization_order,lVar5);
    if (((order->being_deleted == 1) && (order->p != (plugin)0x0)) && (uVar1 == order->id)) {
      vector_push_back(uVar3,&order);
      order->being_deleted = 0;
    }
  }
  while( true ) {
    lVar2 = vector_size(uVar3);
    if (lVar2 == 0) break;
    puVar4 = (undefined8 *)vector_back(uVar3);
    puVar4 = (undefined8 *)*puVar4;
    if ((plugin)puVar4[1] != manager_impl->host) {
      impl_00 = (loader_impl)plugin_impl();
      plugin_destroy_delayed(puVar4[1]);
      loader_manager_impl_set_destroyed(manager_impl,impl_00);
    }
    *(undefined4 *)(puVar4 + 2) = 1;
    puVar4[1] = 0;
    *puVar4 = 0xffffffffffffffff;
    vector_pop_back(uVar3);
  }
  vector_destroy(uVar3);
  if (local_38 != (loader_impl)0x0) {
    loader_impl_destroy_objects(local_38);
  }
  return;
}

Assistant:

void loader_unload_children(loader_impl impl)
{
	loader_manager_impl manager_impl = plugin_manager_impl_type(&loader_manager, loader_manager_impl);
	uint64_t current = thread_id_get_current();
	size_t iterator, size = vector_size(manager_impl->initialization_order);
	vector stack = vector_create_type(loader_initialization_order);

	/* Get all loaders that have been initialized in the current thread */
	for (iterator = 0; iterator < size; ++iterator)
	{
		loader_initialization_order order = vector_at(manager_impl->initialization_order, iterator);

		if (order->being_deleted == 1 && order->p != NULL && current == order->id)
		{
			/* Mark for deletion */
			vector_push_back(stack, &order);

			/* Start to delete the current loader */
			order->being_deleted = 0;
		}
	}

	/* Free all loaders of the current thread and with BFS, look for children */
	while (vector_size(stack) != 0)
	{
		loader_initialization_order order = vector_back_type(stack, loader_initialization_order);

		/* TODO: Disable logs here until log is completely thread safe and async signal safe */
		/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader unloading (%s) from thread #%" PRIuS, plugin_name(order->p), order->id); */

		/* Call recursively for deletion of children */
		if (order->p != manager_impl->host)
		{
			loader_impl destroyed_impl = plugin_impl_type(order->p, loader_impl);

			/* This will execute the desctructor but it will prevent to unload the plugins.
			* This is necessary in order to protect the destruction of the memory, otherwhise
			* it can happen that a node function wrapping a python function get destroyed after
			* the loader has been unloaded, and the function interface will point to an unloaded
			* plugin, generating a segmentation fault. All the plugins will be unloaded on plugin_manager_destroy.
			*/
			plugin_destroy_delayed(order->p);

			/* Mark loader as destroyed (prevents access to already freed memory and defines what loaders are destroyed) */
			loader_manager_impl_set_destroyed(manager_impl, destroyed_impl);
		}

		/* Clear current order */
		order->being_deleted = 1;
		order->p = NULL;
		order->id = THREAD_ID_INVALID;

		vector_pop_back(stack);
	}

	vector_destroy(stack);

	/* Clear all objects and types related to the loader once all childs have been destroyed */
	if (impl != NULL)
	{
		loader_impl_destroy_objects(impl);
	}
}